

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O1

void __thiscall Graph::~Graph(Graph *this)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  pointer piVar2;
  void *pvVar3;
  long lVar4;
  
  pvVar1 = this->adjacencyVector;
  if (pvVar1 != (vector<int,_std::allocator<int>_> *)0x0) {
    piVar2 = pvVar1[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    if (piVar2 != (pointer)0x0) {
      lVar4 = (long)piVar2 * 0x18;
      do {
        pvVar3 = *(void **)((long)&pvVar1[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start + lVar4);
        if (pvVar3 != (void *)0x0) {
          operator_delete(pvVar3);
        }
        lVar4 = lVar4 + -0x18;
      } while (lVar4 != 0);
    }
    operator_delete__(&pvVar1[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  }
  if (this->inDegree != (int *)0x0) {
    operator_delete__(this->inDegree);
    return;
  }
  return;
}

Assistant:

Graph::~Graph() {
    delete[] adjacencyVector;
    delete[] inDegree;
}